

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_add_reference_callback_reached_after_ownership_changed_Test::TestBody::
anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this,void *data,size_t len,void *vdata)

{
  bfy_iovec *iop;
  void *vdata_local;
  size_t len_local;
  void *data_local;
  anon_class_1_0_00000001 *this_local;
  
  *(void **)vdata = data;
  *(size_t *)((long)vdata + 8) = len;
  return;
}

Assistant:

TEST(Buffer, add_reference_callback_reached_after_ownership_changed) {
    auto cb = [](void* data, size_t len, void* vdata) {
        auto* iop = reinterpret_cast<bfy_iovec*>(vdata);
        iop->iov_base = data;
        iop->iov_len = len;
    };

    // setup: add the reference to one buffer
    auto src = bfy_buffer_init();
    auto constexpr str = std::string_view { "Lorem ipsum dolor sit amet" };
    auto io = bfy_iovec {};
    EXPECT_EQ(0, bfy_buffer_add_reference(&src, std::data(str), std::size(str), cb, &io));
    EXPECT_EQ(std::size(str), bfy_buffer_get_content_len(&src));

    // transfer the contents to another buffer
    auto tgt = bfy_buffer_init();
    bfy_buffer_add_buffer(&tgt, &src);
    EXPECT_EQ(0, bfy_buffer_get_content_len(&src));
    EXPECT_EQ(std::size(str), bfy_buffer_get_content_len(&tgt));

    // confirm that destroying the src buffer does not invoke the unref function
    bfy_buffer_destruct(&src);
    EXPECT_EQ(0, io.iov_len);
    EXPECT_EQ(nullptr, io.iov_base);

    // confirm that destroying the tgt buffer *does* invoke the callback
    // since that is who owns the reference now
    bfy_buffer_destruct(&tgt);
    EXPECT_EQ(std::size(str), io.iov_len);
    EXPECT_EQ(std::data(str), io.iov_base);
}